

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GB.cpp
# Opt level: O0

void __thiscall OpenMD::GB::initialize(GB *this)

{
  bool bVar1;
  iterator this_00;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> *this_01;
  long in_RDI;
  RealType RVar2;
  iterator at;
  ForceFieldOptions *fopts;
  AtomType *in_stack_00000268;
  GB *in_stack_00000270;
  set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  *in_stack_ffffffffffffffa8;
  _Self local_40;
  size_type in_stack_ffffffffffffffc8;
  _Self in_stack_ffffffffffffffd0;
  size_type in_stack_ffffffffffffffd8;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar3;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3f3f8c);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x3f3f9a);
  std::
  vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
  ::clear((vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
           *)0x3f3fa8);
  *(undefined4 *)(in_RDI + 0x90) = 0;
  this_01 = (_Rb_tree_const_iterator<OpenMD::AtomType_*> *)(in_RDI + 0x60);
  ForceField::getNAtomType((ForceField *)0x3f3fcf);
  uVar3 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffe0._M_node,
             in_stack_ffffffffffffffd8,(value_type_conflict1 *)in_stack_ffffffffffffffd0._M_node);
  ForceField::getForceFieldOptions(*(ForceField **)(in_RDI + 0x98));
  RVar2 = ForceFieldOptions::getGayBerneMu((ForceFieldOptions *)0x3f4009);
  *(RealType *)(in_RDI + 0xd0) = RVar2;
  RVar2 = ForceFieldOptions::getGayBerneNu((ForceFieldOptions *)0x3f4020);
  *(RealType *)(in_RDI + 0xd8) = RVar2;
  std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)&stack0xffffffffffffffe0);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::begin
            (in_stack_ffffffffffffffa8);
  while( true ) {
    this_00 = std::
              set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              ::end(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,(_Self *)&stack0xffffffffffffffd0);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*(this_01);
    bVar1 = AtomType::isGayBerne((AtomType *)CONCAT44(uVar3,in_stack_fffffffffffffff0));
    if (bVar1) {
      *(int *)(in_RDI + 0x90) = *(int *)(in_RDI + 0x90) + 1;
    }
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*(this_01);
    bVar1 = AtomType::isLennardJones((AtomType *)CONCAT44(uVar3,in_stack_fffffffffffffff0));
    if (bVar1) {
      *(int *)(in_RDI + 0x90) = *(int *)(in_RDI + 0x90) + 1;
    }
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator++(this_01);
  }
  std::
  vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
  ::resize((vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
            *)this_00._M_node,in_stack_ffffffffffffffc8);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::begin
            (in_stack_ffffffffffffffa8);
  do {
    local_40._M_node =
         (_Base_ptr)
         std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
         ::end(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,&local_40);
    if (!bVar1) {
      *(undefined1 *)(in_RDI + 8) = 1;
      return;
    }
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*(this_01);
    bVar1 = AtomType::isGayBerne((AtomType *)CONCAT44(uVar3,in_stack_fffffffffffffff0));
    if (bVar1) {
LAB_003f417c:
      std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*(this_01);
      addType(in_stack_00000270,in_stack_00000268);
    }
    else {
      std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*(this_01);
      bVar1 = AtomType::isLennardJones((AtomType *)CONCAT44(uVar3,in_stack_fffffffffffffff0));
      if (bVar1) goto LAB_003f417c;
    }
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator++(this_01);
  } while( true );
}

Assistant:

void GB::initialize() {
    GBtypes.clear();
    GBtids.clear();
    MixingMap.clear();
    nGB_ = 0;

    GBtids.resize(forceField_->getNAtomType(), -1);

    ForceFieldOptions& fopts = forceField_->getForceFieldOptions();
    mu_                      = fopts.getGayBerneMu();
    nu_                      = fopts.getGayBerneNu();

    // GB handles all of the GB-GB interactions as well as GB-LJ cross
    // interactions:
    AtomTypeSet::iterator at;
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isGayBerne()) nGB_++;
      if ((*at)->isLennardJones()) nGB_++;
    }

    MixingMap.resize(nGB_);
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isGayBerne() || (*at)->isLennardJones()) addType(*at);
    }

    initialized_ = true;
  }